

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_andnot(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  ulong uVar1;
  uint8_t type;
  art_val_t *paVar2;
  art_val_t *paVar3;
  _Bool _Var4;
  int iVar5;
  roaring64_bitmap_t *r;
  leaf_t lVar6;
  container_t *c;
  uint8_t result_typecode;
  roaring64_bitmap_t *local_158;
  art_iterator_t it2;
  art_iterator_t it1;
  
  r = roaring64_bitmap_create();
  art_init_iterator(&it1,&r1->art,true);
  local_158 = r2;
  art_init_iterator(&it2,&r2->art,true);
  do {
    while( true ) {
      paVar3 = it1.value;
      paVar2 = it2.value;
      if (it1.value == (art_val_t *)0x0) {
        return r;
      }
      if (it2.value != (art_val_t *)0x0) break;
LAB_0011ddbe:
      lVar6 = copy_leaf_container(r1,r,*paVar3);
      art_insert(&r->art,it1.key,lVar6);
      art_iterator_next(&it1);
    }
    iVar5 = art_compare_keys(it1.key,it2.key);
    if (iVar5 == 0) {
      uVar1 = *paVar3;
      c = container_andnot(r1->containers[uVar1 >> 8],(uint8_t)uVar1,
                           local_158->containers[*paVar2 >> 8],(uint8_t)*paVar2,&result_typecode);
      type = result_typecode;
      _Var4 = container_nonzero_cardinality(c,result_typecode);
      if (_Var4) {
        lVar6 = add_container(r,c,type);
        art_insert(&r->art,it1.key,lVar6);
      }
      else {
        container_free(c,type);
      }
      art_iterator_next(&it1);
    }
    else if (iVar5 < 0) goto LAB_0011ddbe;
    art_iterator_next(&it2);
  } while( true );
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_andnot(const roaring64_bitmap_t *r1,
                                            const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> output it1, it1++
        // 2. it1_present && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t result_typecode;
                container_t *result_container = container_andnot(
                    get_container(r1, *leaf1), get_typecode(*leaf1),
                    get_container(r2, leaf2), get_typecode(leaf2),
                    &result_typecode);

                if (container_nonzero_cardinality(result_container,
                                                  result_typecode)) {
                    leaf_t result_leaf = add_container(result, result_container,
                                                       result_typecode);
                    art_insert(&result->art, it1.key, (art_val_t)result_leaf);
                } else {
                    container_free(result_container, result_typecode);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            leaf_t result_leaf =
                copy_leaf_container(r1, result, (leaf_t)*it1.value);
            art_insert(&result->art, it1.key, (art_val_t)result_leaf);
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
    return result;
}